

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::
Fold_Right_Binary_Operator_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
::do_oper(Fold_Right_Binary_Operator_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
          *this,Dispatch_State *t_ss,string *t_oper_string,Boxed_Value *t_lhs)

{
  bool bVar1;
  Type_Info *this_00;
  Dispatch_Engine *pDVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Boxed_Value *in_R8;
  Boxed_Value BVar4;
  string_view t_name;
  dispatch_error *e;
  __sv_type local_b8;
  Function_Params local_a8;
  undefined1 local_98 [8];
  array<chaiscript::Boxed_Value,_2UL> params;
  Function_Push_Pop fpp;
  arithmetic_error *anon_var_0;
  Boxed_Value *t_lhs_local;
  string *t_oper_string_local;
  Dispatch_State *t_ss_local;
  Fold_Right_Binary_Operator_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
  *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  this_00 = Boxed_Value::get_type_info(in_R8);
  bVar1 = Type_Info::is_arithmetic(this_00);
  if (bVar1) {
    BVar4 = Boxed_Number::do_oper
                      ((Boxed_Number *)this,*(Opers *)&t_ss[3].m_stack_holder._M_data,in_R8,
                       (Boxed_Value *)&t_ss[3].m_conversions);
    _Var3._M_pi = BVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    detail::Function_Push_Pop::Function_Push_Pop
              ((Function_Push_Pop *)
               &params._M_elems[1].m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Dispatch_State *)t_oper_string);
    Boxed_Value::Boxed_Value((Boxed_Value *)local_98,in_R8);
    Boxed_Value::Boxed_Value
              ((Boxed_Value *)
               &params._M_elems[0].m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Boxed_Value *)&t_ss[3].m_conversions);
    Function_Params::Function_Params<2ul>(&local_a8,(array<chaiscript::Boxed_Value,_2UL> *)local_98)
    ;
    detail::Function_Push_Pop::save_params
              ((Function_Push_Pop *)
               &params._M_elems[1].m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_a8);
    pDVar2 = chaiscript::detail::Dispatch_State::operator->((Dispatch_State *)t_oper_string);
    local_b8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)t_lhs);
    Function_Params::Function_Params<2ul>
              ((Function_Params *)&e,(array<chaiscript::Boxed_Value,_2UL> *)local_98);
    chaiscript::detail::Dispatch_State::conversions((Dispatch_State *)t_oper_string);
    t_name._M_str = (char *)local_b8._M_len;
    t_name._M_len = (size_t)pDVar2;
    chaiscript::detail::Dispatch_Engine::call_function
              ((Dispatch_Engine *)this,t_name,(atomic_uint_fast32_t *)local_b8._M_str,
               (Function_Params *)(t_ss + 4),(Type_Conversions_State *)&e);
    std::array<chaiscript::Boxed_Value,_2UL>::~array
              ((array<chaiscript::Boxed_Value,_2UL> *)local_98);
    detail::Function_Push_Pop::~Function_Push_Pop
              ((Function_Push_Pop *)
               &params._M_elems[1].m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    _Var3._M_pi = extraout_RDX;
  }
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_oper(const chaiscript::detail::Dispatch_State &t_ss, const std::string &t_oper_string, const Boxed_Value &t_lhs) const {
        try {
          if (t_lhs.get_type_info().is_arithmetic()) {
            // If it's an arithmetic operation we want to short circuit dispatch
            try {
              return Boxed_Number::do_oper(m_oper, t_lhs, m_rhs);
            } catch (const chaiscript::exception::arithmetic_error &) {
              throw;
            } catch (...) {
              throw exception::eval_error("Error with numeric operator calling: " + t_oper_string);
            }
          } else {
            chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);
            std::array<Boxed_Value, 2> params{t_lhs, m_rhs};
            fpp.save_params(Function_Params{params});
            return t_ss->call_function(t_oper_string, m_loc, Function_Params{params}, t_ss.conversions());
          }
        } catch (const exception::dispatch_error &e) {
          throw exception::eval_error("Can not find appropriate '" + t_oper_string + "' operator.", e.parameters, e.functions, false, *t_ss);
        }
      }